

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlockBase.h
# Opt level: O3

void __thiscall
dg::ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
          (ElemWithEdges<dg::dda::RWBBlock> *this,RWBBlock *s)

{
  pointer *pppRVar1;
  iterator iVar2;
  RWBBlock **ppRVar3;
  EdgesT *__range2;
  RWBBlock *local_20;
  RWBBlock *local_18;
  
  iVar2._M_current =
       (this->_successors).
       super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (ppRVar3 = (this->_successors).
                 super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppRVar3 != iVar2._M_current;
      ppRVar3 = ppRVar3 + 1) {
    if (*ppRVar3 == s) {
      return;
    }
  }
  local_18 = s;
  if (iVar2._M_current ==
      (this->_successors).
      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>>::
    _M_realloc_insert<dg::dda::RWBBlock*const&>
              ((vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>> *)this,iVar2,&local_18
              );
  }
  else {
    *iVar2._M_current = s;
    pppRVar1 = &(this->_successors).
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  ppRVar3 = (local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._predecessors
            .super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _predecessors.
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data + 8);
  while( true ) {
    if (ppRVar3 == iVar2._M_current) {
      local_20 = (RWBBlock *)
                 &this[-1]._predecessors.
                  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                   super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                   _predecessors.
                   super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>>::
        _M_realloc_insert<dg::dda::RWBBlock*>
                  ((vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>> *)
                   &(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                    super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                    _predecessors,iVar2,&local_20);
      }
      else {
        *iVar2._M_current = local_20;
        pppRVar1 = (pointer *)
                   ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                           super_CFGElement<dg::dda::RWBBlock>.
                           super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
                           super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
        *pppRVar1 = *pppRVar1 + 1;
      }
      return;
    }
    if (&((*ppRVar3)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
         super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock> == this &&
        *ppRVar3 != (RWBBlock *)0x0) break;
    ppRVar3 = ppRVar3 + 1;
  }
  return;
}

Assistant:

void addSuccessor(ElemT *s) {
        for (auto *succ : _successors) {
            if (succ == s)
                return;
        }

        _successors.push_back(s);

        for (auto *pred : s->_predecessors) {
            if (pred == this)
                return;
        }
        s->_predecessors.push_back(static_cast<ElemT *>(this));
    }